

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  int iVar1;
  reference pdVar2;
  void *pvVar3;
  ostream *poVar4;
  double dVar5;
  int local_2b0;
  int local_2ac;
  int i;
  int t;
  int tmp;
  int num;
  vector<double,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_> input;
  undefined1 local_278 [8];
  ifstream ifs;
  undefined1 local_70 [8];
  ESOINN model;
  
  model.c2._4_4_ = 0;
  soinn::ESOINN::ESOINN((ESOINN *)local_70,4,4,0x1e,0.001,1.0);
  std::ifstream::ifstream(local_278);
  std::ifstream::open(local_278,"input.txt",8);
  std::ifstream::open(local_278,"iris.txt",8);
  boost::numeric::ublas::
  vector<double,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>::vector
            ((vector<double,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
              *)&tmp,4);
  for (local_2ac = 0; local_2ac < 0x96; local_2ac = local_2ac + 1) {
    for (local_2b0 = 0; local_2b0 < 4; local_2b0 = local_2b0 + 1) {
      std::istream::operator>>(local_278,&i);
      dVar5 = (double)i;
      pdVar2 = boost::numeric::ublas::
               vector<double,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
               ::operator()((vector<double,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                             *)&tmp,(long)local_2b0);
      *pdVar2 = dVar5;
    }
    soinn::ESOINN::process
              ((ESOINN *)local_70,
               (vector<double,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                *)&tmp);
    pvVar3 = (void *)std::ostream::operator<<(&std::cout,local_2ac);
    std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  }
  soinn::ESOINN::classify((ESOINN *)local_70);
  poVar4 = std::operator<<((ostream *)&std::cout,"number of classes: ");
  iVar1 = soinn::ESOINN::getNumberOfClasses((ESOINN *)local_70);
  pvVar3 = (void *)std::ostream::operator<<(poVar4,iVar1);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)&std::cout,"number of vertices: ");
  iVar1 = soinn::ESOINN::getNumberOfVertices((ESOINN *)local_70);
  pvVar3 = (void *)std::ostream::operator<<(poVar4,iVar1);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  boost::numeric::ublas::
  vector<double,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>::~vector
            ((vector<double,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
              *)&tmp);
  std::ifstream::~ifstream(local_278);
  soinn::ESOINN::~ESOINN((ESOINN *)local_70);
  return model.c2._4_4_;
}

Assistant:

int main() {
    soinn::ESOINN model(4, 4, 30);
    std::ifstream ifs;
    ifs.open("input.txt");
    ifs.open("iris.txt");
    boost::numeric::ublas::vector<double> input(4);
    int num;
    int tmp;
    for(int t = 0; t < 150; t++) {
        for(int i = 0; i < 4; i++) {
            ifs>>tmp;
            input(i) = double(tmp);
        }
        model.process(input);
        std::cout<<t<<std::endl;
    }
    model.classify();
    std::cout<<"number of classes: "<<model.getNumberOfClasses()<<std::endl;
    std::cout<<"number of vertices: "<<model.getNumberOfVertices()<<std::endl;
}